

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::SubtractPropagateStatistics::Operation<short,duckdb::TryDecimalSubtract>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  short sVar2;
  short sVar3;
  int64_t value;
  int64_t value_00;
  Value local_70;
  
  sVar2 = NumericStats::GetMin<short>(lstats);
  sVar3 = NumericStats::GetMax<short>(rstats);
  if (sVar3 < 0) {
    if (sVar3 + 9999 < (int)sVar2) goto LAB_00993989;
LAB_0099399a:
    value_00 = (int64_t)(short)(sVar2 - sVar3);
    bVar1 = true;
  }
  else {
    if (sVar3 + -9999 <= (int)sVar2) goto LAB_0099399a;
LAB_00993989:
    value_00 = 0;
    bVar1 = false;
  }
  if (!bVar1) {
    return true;
  }
  sVar2 = NumericStats::GetMax<short>(lstats);
  sVar3 = NumericStats::GetMin<short>(rstats);
  if (sVar3 < 0) {
    if (sVar3 + 9999 < (int)sVar2) goto LAB_009939d4;
  }
  else if ((int)sVar2 < sVar3 + -9999) {
LAB_009939d4:
    value = 0;
    bVar1 = false;
    goto LAB_009939ec;
  }
  value = (int64_t)(short)(sVar2 - sVar3);
  bVar1 = true;
LAB_009939ec:
  if (bVar1) {
    Value::Numeric(&local_70,type,value_00);
    Value::operator=(new_min,&local_70);
    Value::~Value(&local_70);
    Value::Numeric(&local_70,type,value);
    Value::operator=(new_max,&local_70);
    Value::~Value(&local_70);
  }
  return !bVar1;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(rstats), min)) {
			return true;
		}
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMin<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}